

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

void __thiscall
Generator_algebraicUnknownVarOnRhs_Test::TestBody(Generator_algebraicUnknownVarOnRhs_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  GeneratorProfilePtr profile;
  GeneratorPtr generator;
  AssertionResult gtest_ar_4;
  AnalyserPtr analyser;
  AnalyserModelPtr analyserModel;
  ModelPtr model;
  ParserPtr parser;
  long *local_f0 [2];
  long local_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  shared_ptr *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  internal local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  shared_ptr *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Parser::create(SUB81(local_30,0));
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"generator/algebraic_unknown_var_on_rhs/model.cellml","");
  fileContents((string *)&local_d0);
  libcellml::Parser::parseModel(local_40);
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p),
                    local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  local_f0[0] = (long *)0x0;
  local_b0._M_dataplus._M_p = (pointer)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_d0,"size_t(0)","parser->issueCount()",(unsigned_long *)local_f0,
             (unsigned_long *)&local_b0);
  if ((char)local_d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_f0);
    if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x116,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_f0[0] != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_f0[0] != (long *)0x0)) {
        (**(code **)(*local_f0[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel(local_60);
  local_f0[0] = (long *)0x0;
  local_b0._M_dataplus._M_p = (pointer)libcellml::Logger::errorCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_d0,"size_t(0)","analyser->errorCount()",(unsigned_long *)local_f0,
             (unsigned_long *)&local_b0);
  if ((char)local_d0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_f0);
    if ((undefined8 *)local_d0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_d0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x11c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_f0[0] != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_f0[0] != (long *)0x0)) {
        (**(code **)(*local_f0[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::Analyser::model();
  libcellml::Generator::create();
  libcellml::Generator::setModel(local_80);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"generator/algebraic_unknown_var_on_rhs/model.h","");
  fileContents((string *)&local_d0);
  libcellml::Generator::interfaceCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_90,"fileContents(\"generator/algebraic_unknown_var_on_rhs/model.h\")",
             "generator->interfaceCode()",&local_d0,&local_b0);
  paVar2 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p),
                    local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x123,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
    if (CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) != 0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((long *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                       (char)local_d0._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"generator/algebraic_unknown_var_on_rhs/model.c","");
  fileContents((string *)&local_d0);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_90,"fileContents(\"generator/algebraic_unknown_var_on_rhs/model.c\")",
             "generator->implementationCode()",&local_d0,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p),
                    local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x124,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
    if (CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) != 0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((long *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                       (char)local_d0._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  libcellml::GeneratorProfile::create((Profile)local_90);
  libcellml::Generator::setProfile(local_80);
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"generator/algebraic_unknown_var_on_rhs/model.py","");
  fileContents((string *)&local_d0);
  libcellml::Generator::implementationCode_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_70,"fileContents(\"generator/algebraic_unknown_var_on_rhs/model.py\")",
             "generator->implementationCode()",&local_d0,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p),
                    local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generator.cpp"
               ,0x12a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_f0,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_f0);
    if (CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) != 0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((long *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,(char)local_d0._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_d0._M_dataplus._M_p._1_7_,
                                       (char)local_d0._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_88.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.ptr_);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Generator, algebraicUnknownVarOnRhs)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/algebraic_unknown_var_on_rhs/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();
    auto generator = libcellml::Generator::create();

    generator->setModel(analyserModel);

    EXPECT_EQ(fileContents("generator/algebraic_unknown_var_on_rhs/model.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("generator/algebraic_unknown_var_on_rhs/model.c"), generator->implementationCode());

    auto profile = libcellml::GeneratorProfile::create(libcellml::GeneratorProfile::Profile::PYTHON);

    generator->setProfile(profile);

    EXPECT_EQ(fileContents("generator/algebraic_unknown_var_on_rhs/model.py"), generator->implementationCode());
}